

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-fixed-contact-dynamical-system.cpp
# Opt level: O1

Vector __thiscall
stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::stateDynamics
          (IMUFixedContactDynamicalSystem *this,Vector *x,Vector *param_2,TimeIndex param_3)

{
  undefined8 *puVar1;
  _func_int **pp_Var2;
  long lVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  undefined8 uVar8;
  char cVar9;
  PointerType ptr;
  ulong uVar10;
  char *__function;
  Index extraout_RDX;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar17 [16];
  double extraout_XMM0_Qb_00;
  double dVar19;
  undefined1 auVar18 [16];
  undefined4 uVar20;
  undefined4 uVar21;
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  Vector VVar25;
  Vector xk1;
  Vector3 orientationFlexV;
  Vector3 angularVelocityFlex;
  Vector3 velocityFlex;
  Vector3 positionFlex;
  Quaternion orientationFlex;
  AngleAxis orientationAA;
  DenseStorage<double,__1,__1,_1,_0> local_1b8;
  undefined1 local_1a8 [16];
  double local_198;
  undefined8 uStack_190;
  double local_188;
  double local_180;
  Vector3 local_178;
  double local_158 [4];
  double local_138 [4];
  double local_118 [4];
  undefined1 local_f8 [16];
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  Quaternion local_b8;
  undefined1 local_98 [16];
  double local_88;
  undefined8 uStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  AngleAxis<double> local_58;
  
  cVar9 = (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data[8])(x,param_2);
  if (cVar9 == '\0') {
    __assert_fail("checkStateVector(v) && \"ERROR: The state vector has the wrong size\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/dynamical-system/dynamical-system-functor-base.hpp"
                  ,0x40,
                  "void stateObservation::DynamicalSystemFunctorBase::assertStateVector_(const Vector &)"
                 );
  }
  lVar3 = (param_2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  if (2 < lVar3) {
    pdVar4 = (param_2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    local_118[0] = *pdVar4;
    local_118[1] = pdVar4[1];
    local_118[2] = pdVar4[2];
    if (8 < lVar3) {
      local_138[0] = pdVar4[6];
      local_138[1] = pdVar4[7];
      local_138[2] = pdVar4[8];
      if (0xe < lVar3) {
        local_1a8._0_8_ = local_118[2];
        local_78 = pdVar4[0xc];
        dStack_70 = pdVar4[0xd];
        local_f8._0_8_ = pdVar4[0xe];
        local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array._0_16_ = *(undefined1 (*) [16])(pdVar4 + 3);
        local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = pdVar4[5];
        local_158[0] = pdVar4[9];
        local_158[1] = pdVar4[10];
        local_180 = pdVar4[0xb];
        local_198 = local_138[2];
        local_158[2] = local_180;
        local_e8 = local_138[0];
        dStack_e0 = local_138[1];
        local_c8 = local_158[0];
        dStack_c0 = local_158[1];
        local_68 = local_118[0];
        dStack_60 = local_118[1];
        if (0x11 < lVar3) {
          local_d8 = pdVar4[0xf];
          dStack_d0 = pdVar4[0x10];
          local_188 = pdVar4[0x11];
          computeQuaternion_(&local_b8,(IMUFixedContactDynamicalSystem *)x,&local_178);
          local_88 = (double)x[0x12].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows;
          uStack_190 = 0;
          dVar22 = local_88 * 0.5 * local_88;
          local_118[0] = local_68 + local_78 * dVar22 + local_e8 * local_88;
          local_118[1] = dStack_60 + dStack_70 * dVar22 + dStack_e0 * local_88;
          local_118[2] = (double)local_1a8._0_8_ +
                         (double)local_f8._0_8_ * dVar22 + local_198 * local_88;
          local_138[0] = local_78 * local_88 + local_e8;
          local_138[1] = dStack_70 * local_88 + dStack_e0;
          local_138[2] = (double)local_f8._0_8_ * local_88 + local_198;
          local_1a8._0_8_ = dVar22 * local_d8 + local_c8 * local_88;
          local_1a8._8_8_ = dVar22 * dStack_d0 + dStack_c0 * local_88;
          local_198 = dVar22 * local_188 + local_180 * local_88;
          dVar22 = local_198 * local_198 +
                   (double)local_1a8._8_8_ * (double)local_1a8._8_8_ +
                   (double)local_1a8._0_8_ * (double)local_1a8._0_8_;
          uStack_80 = 0;
          local_98._8_4_ = SUB84(local_88,0);
          local_98._0_8_ = local_88;
          local_98._12_4_ = (int)((ulong)local_88 >> 0x20);
          dVar6 = 0.0;
          uVar20 = 0;
          uVar21 = 0;
          if (dVar22 <= 9.999999999999999e-33) {
            local_198 = 1.0;
            uStack_190 = 0;
            local_1a8 = ZEXT816(0);
          }
          else {
            if (dVar22 < 0.0) {
              uStack_190 = 0;
              dVar22 = sqrt(dVar22);
              uVar20 = (undefined4)extraout_XMM0_Qb;
              uVar21 = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
            }
            else {
              uVar20 = 0;
              uVar21 = 0;
              dVar22 = SQRT(dVar22);
            }
            auVar17._8_8_ = dVar22;
            auVar17._0_8_ = dVar22;
            local_1a8 = divpd(local_1a8,auVar17);
            local_198 = local_198 / dVar22;
            dVar6 = dVar22 * 0.5;
          }
          local_f8._8_4_ = uVar20;
          local_f8._0_8_ = dVar6;
          local_f8._12_4_ = uVar21;
          local_e8 = cos(dVar6);
          dStack_e0 = extraout_XMM0_Qb_00;
          dVar14 = sin((double)local_f8._0_8_);
          dVar24 = local_198 * dVar14;
          dVar15 = dVar14 * (double)local_1a8._0_8_;
          dVar14 = dVar14 * (double)local_1a8._8_8_;
          dVar16 = dVar14 * local_b8.m_coeffs.
                            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                            m_data.array[0];
          dVar19 = dVar14 * local_b8.m_coeffs.
                            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                            m_data.array[1];
          dVar22 = dVar15 * local_b8.m_coeffs.
                            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                            m_data.array[0];
          dVar6 = dVar15 * local_b8.m_coeffs.
                           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[1];
          dVar7 = local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                  m_storage.m_data.array[0] * dVar24 -
                  local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                  m_storage.m_data.array[2] * dVar15;
          auVar23._8_4_ = SUB84(dVar7,0);
          auVar23._0_8_ =
               local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[1] * dVar24 -
               local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[3] * dVar15;
          auVar23._12_4_ = (int)((ulong)dVar7 >> 0x20);
          local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array[0] =
               SUB168(auVar23 ^ _DAT_00199020,0) +
               local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[2] * dVar14 +
               local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[0] * local_e8;
          local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array[1] =
               SUB168(auVar23 ^ _DAT_00199020,8) +
               local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[3] * dVar14 +
               local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[1] * local_e8;
          dVar22 = dVar22 + dVar24 * local_b8.m_coeffs.
                                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                     m_storage.m_data.array[2];
          auVar18._8_4_ = SUB84(dVar22,0);
          auVar18._0_8_ =
               dVar6 + dVar24 * local_b8.m_coeffs.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                m_storage.m_data.array[3];
          auVar18._12_4_ = (int)((ulong)dVar22 >> 0x20);
          local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array[2] =
               SUB168(auVar18 ^ _DAT_00199030,0) +
               (local_e8 *
                local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[2] - dVar16);
          local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array[3] =
               SUB168(auVar18 ^ _DAT_00199030,8) +
               (local_e8 *
                local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[3] - dVar19);
          local_158[0] = local_c8 + local_d8 * (double)local_98._0_8_;
          local_158[1] = dStack_c0 + dStack_d0 * (double)local_98._8_8_;
          local_158[2] = local_180 + local_188 * local_88;
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                    (&local_1b8,(DenseStorage<double,__1,__1,_1,_0> *)param_2);
          pdVar4 = local_1b8.m_data;
          if (2 < local_1b8.m_rows) {
            uVar13 = 3;
            if (((ulong)local_1b8.m_data & 7) == 0) {
              uVar13 = (ulong)((uint)((ulong)local_1b8.m_data >> 3) & 1);
            }
            uVar11 = (uint)(uVar13 ^ 3);
            iVar12 = (int)uVar13;
            if (uVar13 != 0) {
              memcpy(local_1b8.m_data,local_118,(ulong)(uint)(iVar12 * 8));
            }
            if (1 < uVar11) {
              uVar10 = (ulong)(uint)(iVar12 * 8);
              uVar8 = *(undefined8 *)((long)local_118 + uVar10 + 8);
              puVar1 = (undefined8 *)((long)pdVar4 + uVar10);
              *puVar1 = *(undefined8 *)((long)local_118 + uVar10);
              puVar1[1] = uVar8;
            }
            if ((uVar11 & 0xfffffffe) + iVar12 < 3) {
              uVar10 = (ulong)((iVar12 + (uVar11 & 0xfffffffe)) * 8);
              memcpy((void *)((long)pdVar4 + uVar10),(void *)((long)local_118 + uVar10),
                     ((uVar13 ^ 3) - (ulong)(uVar11 & 0xfffffffe)) * 8);
            }
            pdVar4 = local_1b8.m_data;
            if (8 < local_1b8.m_rows) {
              pp_Var2 = (_func_int **)(local_1b8.m_data + 6);
              uVar13 = 3;
              if (((ulong)pp_Var2 & 7) == 0) {
                uVar13 = (ulong)((uint)((ulong)pp_Var2 >> 3) & 1);
              }
              uVar11 = (uint)(uVar13 ^ 3);
              iVar12 = (int)uVar13;
              if (uVar13 != 0) {
                memcpy(pp_Var2,local_138,(ulong)(uint)(iVar12 * 8));
              }
              if (1 < uVar11) {
                uVar10 = (ulong)(uint)(iVar12 * 8);
                uVar8 = *(undefined8 *)((long)local_138 + uVar10 + 8);
                puVar1 = (undefined8 *)((long)pdVar4 + uVar10 + 0x30);
                *puVar1 = *(undefined8 *)((long)local_138 + uVar10);
                puVar1[1] = uVar8;
              }
              if ((uVar11 & 0xfffffffe) + iVar12 < 3) {
                uVar10 = (ulong)((iVar12 + (uVar11 & 0xfffffffe)) * 8);
                memcpy((void *)((long)pdVar4 + uVar10 + 0x30),(void *)((long)local_138 + uVar10),
                       ((uVar13 ^ 3) - (ulong)(uVar11 & 0xfffffffe)) * 8);
              }
              Eigen::AngleAxis<double>::operator=
                        (&local_58,(QuaternionBase<Eigen::Quaternion<double,_0>_> *)&local_b8);
              pdVar4 = local_1b8.m_data;
              auVar5._8_4_ = SUB84(local_58.m_angle *
                                   local_58.m_axis.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[1],0);
              auVar5._0_8_ = local_58.m_angle *
                             local_58.m_axis.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data.array[0];
              auVar5._12_4_ =
                   (int)((ulong)(local_58.m_angle *
                                local_58.m_axis.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[1]) >> 0x20);
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] =
                   local_58.m_angle *
                   local_58.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[0];
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1] = (double)auVar5._8_8_;
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[2] =
                   local_58.m_angle *
                   local_58.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[2];
              if (5 < local_1b8.m_rows) {
                pp_Var2 = (_func_int **)(local_1b8.m_data + 3);
                uVar13 = 3;
                if (((ulong)pp_Var2 & 7) == 0) {
                  uVar13 = (ulong)((uint)((ulong)pp_Var2 >> 3) & 1);
                }
                uVar11 = (uint)(uVar13 ^ 3);
                iVar12 = (int)uVar13;
                if (uVar13 != 0) {
                  memcpy(pp_Var2,&local_178,(ulong)(uint)(iVar12 * 8));
                }
                if (1 < uVar11) {
                  uVar10 = (ulong)(uint)(iVar12 * 8);
                  uVar8 = *(undefined8 *)
                           ((long)local_178.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array + uVar10 + 8);
                  puVar1 = (undefined8 *)((long)pdVar4 + uVar10 + 0x18);
                  *puVar1 = *(undefined8 *)
                             ((long)local_178.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array + uVar10);
                  puVar1[1] = uVar8;
                }
                if ((uVar11 & 0xfffffffe) + iVar12 < 3) {
                  uVar10 = (ulong)((iVar12 + (uVar11 & 0xfffffffe)) * 8);
                  memcpy((void *)((long)pdVar4 + uVar10 + 0x18),
                         (void *)((long)local_178.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                        .m_storage.m_data.array + uVar10),
                         ((uVar13 ^ 3) - (ulong)(uVar11 & 0xfffffffe)) * 8);
                }
                pdVar4 = local_1b8.m_data;
                if (0xb < local_1b8.m_rows) {
                  pp_Var2 = (_func_int **)(local_1b8.m_data + 9);
                  uVar13 = 3;
                  if (((ulong)pp_Var2 & 7) == 0) {
                    uVar13 = (ulong)((uint)((ulong)pp_Var2 >> 3) & 1);
                  }
                  uVar11 = (uint)(uVar13 ^ 3);
                  iVar12 = (int)uVar13;
                  if (uVar13 != 0) {
                    memcpy(pp_Var2,local_158,(ulong)(uint)(iVar12 * 8));
                  }
                  if (1 < uVar11) {
                    uVar10 = (ulong)(uint)(iVar12 * 8);
                    uVar8 = *(undefined8 *)((long)local_158 + uVar10 + 8);
                    puVar1 = (undefined8 *)((long)pdVar4 + uVar10 + 0x48);
                    *puVar1 = *(undefined8 *)((long)local_158 + uVar10);
                    puVar1[1] = uVar8;
                  }
                  if ((uVar11 & 0xfffffffe) + iVar12 < 3) {
                    uVar10 = (ulong)((iVar12 + (uVar11 & 0xfffffffe)) * 8);
                    memcpy((void *)((long)pdVar4 + uVar10 + 0x48),(void *)((long)local_158 + uVar10)
                           ,((uVar13 ^ 3) - (ulong)(uVar11 & 0xfffffffe)) * 8);
                  }
                  pdVar4 = x[0x12].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data;
                  if (pdVar4 == (double *)0x0) {
                    (this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase =
                         (_func_int **)local_1b8.m_data;
                    (this->sensor_).super_AlgebraicSensor.super_SensorBase._vptr_SensorBase =
                         (_func_int **)local_1b8.m_rows;
                    local_1b8.m_data = (double *)0x0;
                    local_1b8.m_rows = 0;
                  }
                  else {
                    (**(code **)((long)*pdVar4 + 0x10))(this,pdVar4,&local_1b8);
                  }
                  free(local_1b8.m_data);
                  VVar25.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows = extraout_RDX;
                  VVar25.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data = (double *)this;
                  return (Vector)VVar25.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage;
                }
              }
            }
          }
          __function = 
          "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
          ;
          goto LAB_00152569;
        }
      }
    }
  }
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_00152569:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

Vector IMUFixedContactDynamicalSystem::stateDynamics(const Vector & x, const Vector &, TimeIndex)
{
  assertStateVector_(x);

  Vector3 positionFlex(x.segment(indexes::pos, 3));
  Vector3 velocityFlex(x.segment(indexes::linVel, 3));
  Vector3 accelerationFlex(x.segment(indexes::linAcc, 3));

  Vector3 orientationFlexV(x.segment(indexes::ori, 3));
  Vector3 angularVelocityFlex(x.segment(indexes::angVel, 3));
  Vector3 angularAccelerationFlex(x.segment(indexes::angAcc, 3));

  Quaternion orientationFlex(computeQuaternion_(orientationFlexV));

  kine::integrateKinematics(positionFlex, velocityFlex, accelerationFlex, orientationFlex, angularVelocityFlex,
                            angularAccelerationFlex, dt_);

  // x_{k+1}
  Vector xk1(x);

  xk1.segment(indexes::pos, 3) = positionFlex;
  xk1.segment(indexes::linVel, 3) = velocityFlex;

  AngleAxis orientationAA(orientationFlex);
  orientationFlexV = orientationAA.angle() * orientationAA.axis();

  xk1.segment(indexes::ori, 3) = orientationFlexV;
  xk1.segment(indexes::angVel, 3) = angularVelocityFlex;

  if(processNoise_ != 0x0)
    return processNoise_->getNoisy(xk1);
  else
    return xk1;
}